

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O1

bool __thiscall
cmExecProgramCommand::InitialPass
          (cmExecProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  bool bVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  _Alloc_hider _Var10;
  pointer pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  bool bVar13;
  int iVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  bool bVar16;
  int retVal;
  string command;
  string output_variable;
  string arguments;
  string coutput;
  string return_variable;
  string output;
  uint local_18c;
  cmCommand *local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_180;
  undefined1 *local_178;
  long local_170;
  undefined1 local_168;
  undefined7 uStack_167;
  string local_158;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  string local_118 [3];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_188 = &this->super_cmCommand;
  local_180 = args;
  if (pbVar11 == pbVar1) {
    local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,"called with incorrect number of arguments","");
    cmCommand::SetError(local_188,local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
      operator_delete(local_118[0]._M_dataplus._M_p,local_118[0].field_2._M_allocated_capacity + 1);
    }
    bVar16 = false;
  }
  else {
    local_138 = &local_128;
    bVar16 = false;
    local_130 = 0;
    local_128 = 0;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    bVar5 = false;
    bVar13 = false;
    iVar14 = 0;
    bVar4 = false;
    do {
      iVar6 = std::__cxx11::string::compare((char *)pbVar11);
      if (iVar6 == 0) {
        bVar13 = true;
        bVar4 = false;
LAB_002a0b1e:
        bVar5 = false;
LAB_002a0bec:
        iVar14 = iVar14 + 1;
        bVar2 = true;
      }
      else if (bVar13) {
        if (local_158._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)&local_158);
          iVar14 = iVar14 + 1;
          bVar2 = true;
          bVar13 = false;
        }
        else {
          local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_118,"called with incorrect number of arguments","");
          cmCommand::SetError(local_188,local_118);
LAB_002a0b97:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
            operator_delete(local_118[0]._M_dataplus._M_p,
                            local_118[0].field_2._M_allocated_capacity + 1);
          }
          bVar2 = false;
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)pbVar11);
        if (iVar6 == 0) {
          bVar5 = true;
          bVar4 = false;
          bVar13 = false;
          goto LAB_002a0bec;
        }
        if (bVar5) {
          if (local_b0._M_string_length != 0) {
            local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_118,"called with incorrect number of arguments","");
            cmCommand::SetError(local_188,local_118);
            goto LAB_002a0b97;
          }
          std::__cxx11::string::_M_assign((string *)&local_b0);
          iVar14 = iVar14 + 1;
          bVar2 = true;
          bVar5 = false;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)pbVar11);
          if (iVar6 == 0) {
            bVar4 = true;
            bVar13 = false;
            goto LAB_002a0b1e;
          }
          bVar2 = true;
          if (bVar4) {
            std::__cxx11::string::_M_append((char *)&local_138,(ulong)(pbVar11->_M_dataplus)._M_p);
            std::__cxx11::string::append((char *)&local_138);
            iVar14 = iVar14 + 1;
          }
        }
      }
      pvVar12 = local_180;
      if (!bVar2) break;
      pbVar11 = pbVar11 + 1;
      bVar16 = pbVar11 == pbVar1;
    } while (!bVar16);
    if (bVar16) {
      local_170 = 0;
      local_168 = 0;
      local_178 = &local_168;
      if (local_130 == 0) {
        std::__cxx11::string::_M_assign((string *)&local_178);
      }
      else {
        cmSystemTools::ConvertToRunCommandPath
                  (local_118,
                   (local_180->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::operator=((string *)&local_178,(string *)local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
          operator_delete(local_118[0]._M_dataplus._M_p,
                          local_118[0].field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_178);
        pvVar12 = local_180;
        std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_138);
      }
      sVar3 = local_158._M_string_length;
      local_18c = 0;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      pbVar11 = (pvVar12->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (((long)(pvVar12->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) - (long)iVar14 ==
          2) {
        cmsys::SystemTools::MakeDirectory(pbVar11 + 1,(mode_t *)0x0);
        paVar15 = &local_50.field_2;
        local_50._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_178,local_178 + local_170);
        bVar5 = RunCommand(&local_50,&local_90,(int *)&local_18c,
                           (pvVar12->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,sVar3 == 0
                           ,Auto);
        _Var10._M_p = local_50._M_dataplus._M_p;
      }
      else {
        paVar15 = &local_70.field_2;
        local_70._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_178,local_178 + local_170);
        bVar5 = RunCommand(&local_70,&local_90,(int *)&local_18c,(char *)0x0,sVar3 == 0,Auto);
        _Var10._M_p = local_70._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var10._M_p != paVar15) {
        operator_delete(_Var10._M_p,paVar15->_M_allocated_capacity + 1);
      }
      if (bVar5 == false) {
        local_18c = 0xffffffff;
      }
      if (local_158._M_string_length != 0) {
        uVar7 = std::__cxx11::string::find_first_not_of((char *)&local_90,0x5b6057,0);
        lVar8 = std::__cxx11::string::find_last_not_of
                          ((char *)&local_90,0x5b6057,0xffffffffffffffff);
        if (uVar7 == 0xffffffffffffffff) {
          uVar7 = 0;
        }
        lVar9 = local_90._M_string_length - 1;
        if (lVar8 != -1) {
          lVar9 = lVar8;
        }
        std::__cxx11::string::string
                  ((string *)local_118,(string *)&local_90,uVar7,(lVar9 - uVar7) + 1);
        cmMakefile::AddDefinition(local_188->Makefile,&local_158,local_118[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
          operator_delete(local_118[0]._M_dataplus._M_p,
                          local_118[0].field_2._M_allocated_capacity + 1);
        }
      }
      if (local_b0._M_string_length != 0) {
        sprintf((char *)local_118,"%d",(ulong)local_18c);
        cmMakefile::AddDefinition(local_188->Makefile,&local_b0,(char *)local_118);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      if (local_178 != &local_168) {
        operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
    }
  }
  return bVar16;
}

Assistant:

bool cmExecProgramCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for (std::string const& arg : args) {
    if (arg == "OUTPUT_VARIABLE") {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
    } else if (haveoutput_variable) {
      if (!output_variable.empty()) {
        this->SetError("called with incorrect number of arguments");
        return false;
      }
      output_variable = arg;
      haveoutput_variable = false;
      count++;
    } else if (arg == "RETURN_VALUE") {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
    } else if (havereturn_variable) {
      if (!return_variable.empty()) {
        this->SetError("called with incorrect number of arguments");
        return false;
      }
      return_variable = arg;
      havereturn_variable = false;
      count++;
    } else if (arg == "ARGS") {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
    } else if (doingargs) {
      arguments += arg;
      arguments += " ";
      count++;
    }
  }

  std::string command;
  if (!arguments.empty()) {
    command = cmSystemTools::ConvertToRunCommandPath(args[0]);
    command += " ";
    command += arguments;
  } else {
    command = args[0];
  }
  bool verbose = true;
  if (!output_variable.empty()) {
    verbose = false;
  }
  int retVal = 0;
  std::string output;
  bool result = true;
  if (args.size() - count == 2) {
    cmSystemTools::MakeDirectory(args[1]);
    result = cmExecProgramCommand::RunCommand(command, output, retVal,
                                              args[1].c_str(), verbose);
  } else {
    result = cmExecProgramCommand::RunCommand(command, output, retVal, nullptr,
                                              verbose);
  }
  if (!result) {
    retVal = -1;
  }

  if (!output_variable.empty()) {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if (first == std::string::npos) {
      first = 0;
    }
    if (last == std::string::npos) {
      last = output.size() - 1;
    }

    std::string coutput = std::string(output, first, last - first + 1);
    this->Makefile->AddDefinition(output_variable, coutput.c_str());
  }

  if (!return_variable.empty()) {
    char buffer[100];
    sprintf(buffer, "%d", retVal);
    this->Makefile->AddDefinition(return_variable, buffer);
  }

  return true;
}